

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O3

void __thiscall DCorpsePointer::Destroy(DCorpsePointer *this)

{
  DWORD DVar1;
  AActor *pAVar2;
  DCorpsePointer *pDVar3;
  TThinkerIterator<DCorpsePointer> iterator;
  FThinkerIterator local_30;
  
  FThinkerIterator::FThinkerIterator(&local_30,RegistrationInfo.MyClass,3);
  pDVar3 = (DCorpsePointer *)FThinkerIterator::Next(&local_30,false);
  DVar1 = pDVar3->Count;
  if (pDVar3 == this) {
    pDVar3 = (DCorpsePointer *)FThinkerIterator::Next(&local_30,false);
    if (pDVar3 == (DCorpsePointer *)0x0) goto LAB_004b1978;
  }
  pDVar3->Count = DVar1 - 1;
LAB_004b1978:
  pAVar2 = (this->Corpse).field_0.p;
  if (pAVar2 != (AActor *)0x0) {
    if (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      (*(pAVar2->super_DThinker).super_DObject._vptr_DObject[4])();
    }
    else {
      (this->Corpse).field_0.p = (AActor *)0x0;
    }
  }
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DCorpsePointer::Destroy ()
{
	// Store the count of corpses in the first thinker in the list
	TThinkerIterator<DCorpsePointer> iterator (STAT_CORPSEPOINTER);
	DCorpsePointer *first = iterator.Next ();

	int prevCount = first->Count;

	if (first == this)
	{
		first = iterator.Next ();
	}

	if (first != NULL)
	{
		first->Count = prevCount - 1;
	}

	if (Corpse != NULL)
	{
		Corpse->Destroy ();
	}
	Super::Destroy ();
}